

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceL1LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducel1(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceL1LayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducel1(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducel1(this);
    this_00 = (ReduceL1LayerParams *)operator_new(0x30);
    ReduceL1LayerParams::ReduceL1LayerParams(this_00);
    (this->layer_).reducel1_ = this_00;
  }
  return (ReduceL1LayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL1LayerParams* NeuralNetworkLayer::mutable_reducel1() {
  if (!has_reducel1()) {
    clear_layer();
    set_has_reducel1();
    layer_.reducel1_ = new ::CoreML::Specification::ReduceL1LayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceL1)
  return layer_.reducel1_;
}